

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Bit_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint bit;
  uint x;
  Adaptive_Bit_Model *M_local;
  Arithmetic_Codec *this_local;
  
  uVar2 = M->bit_0_prob * (this->length >> 0xd);
  uVar1 = (uint)(uVar2 <= this->value);
  if (uVar1 == 0) {
    this->length = uVar2;
    M->bit_0_count = M->bit_0_count + 1;
  }
  else {
    this->value = this->value - uVar2;
    this->length = this->length - uVar2;
  }
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  uVar2 = M->bits_until_update - 1;
  M->bits_until_update = uVar2;
  if (uVar2 == 0) {
    Adaptive_Bit_Model::update(M);
  }
  return uVar1;
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        value  -= x;
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update

      return bit;                                         // return data bit value
    }